

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O3

string * __thiscall
LinearSystem::SwapMatrix::ToString_abi_cxx11_(string *__return_storage_ptr__,SwapMatrix *this)

{
  char cVar1;
  ostream *poVar2;
  bool bVar3;
  ostringstream out;
  long local_1a0 [14];
  ios_base local_130 [264];
  
  if (((this->first_row_ == this->second_row_) &&
      (this->first_main_column_ == this->second_main_column_)) &&
     (this->first_extension_column_ == this->second_extension_column_)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    bVar3 = this->first_row_ != this->second_row_;
    if (bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Swap rows: ",0xb);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,this->first_row_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      std::ostream::operator<<((ostream *)poVar2,this->second_row_);
    }
    cVar1 = (char)(ostringstream *)local_1a0;
    if (this->first_main_column_ != this->second_main_column_) {
      if (bVar3) {
        std::ios::widen((char)*(undefined8 *)(local_1a0[0] + -0x18) + cVar1);
        std::ostream::put((char)local_1a0);
        std::ostream::flush();
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Swap column: ",0xd);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,this->first_main_column_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      bVar3 = true;
      std::ostream::operator<<((ostream *)poVar2,this->second_main_column_);
    }
    if (this->first_extension_column_ != this->second_extension_column_) {
      if (bVar3) {
        std::ios::widen(cVar1 + (char)*(undefined8 *)(local_1a0[0] + -0x18));
        std::ostream::put((char)local_1a0);
        std::ostream::flush();
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Swap column: ",0xd);
      poVar2 = (ostream *)
               std::ostream::operator<<((ostream *)local_1a0,this->first_extension_column_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      std::ostream::operator<<((ostream *)poVar2,this->second_extension_column_);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base(local_130);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LinearSystem::SwapMatrix::ToString() const {
  if (IsEmpty()) {
    return "";
  }
  std::ostringstream out;
  bool started = false;
  if (first_row_ != second_row_) {
    started = true;
    out << "Swap rows: " << first_row_  << " " << second_row_;
  }
  if (first_main_column_ != second_main_column_) {
    if (started) {
      out << std::endl;
    }
    started = true;
    out << "Swap column: " << first_main_column_ << " " << second_main_column_;
  }
  if (first_extension_column_ != second_extension_column_) {
    if (started) {
      out << std::endl;
    }
    out << "Swap column: " << first_extension_column_ << " " << second_extension_column_;
  }

  return out.str();
}